

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayoutInfo::separatorRect(QDockAreaLayoutInfo *this,int index)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  const_reference this_00;
  int *piVar4;
  int iVar5;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  QSize s;
  QPoint pos;
  QRect *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  Orientation in_stack_ffffffffffffffa4;
  QDockAreaLayoutItem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar6;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0xb].xp.m_i & 1) == 0) {
    this_00 = QList<QDockAreaLayoutItem>::at
                        ((QList<QDockAreaLayoutItem> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (qsizetype)in_stack_ffffffffffffff98);
    bVar3 = QDockAreaLayoutItem::skip(in_stack_ffffffffffffffa8);
    if (bVar3) {
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    else {
      QRect::topLeft(in_stack_ffffffffffffff98);
      iVar5 = this_00->pos + this_00->size;
      piVar4 = rpick(in_stack_ffffffffffffffa4,(QPoint *)in_stack_ffffffffffffff98);
      *piVar4 = iVar5;
      QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffffb4,iVar5));
      iVar6 = *(int *)*in_RDI;
      piVar4 = rpick(in_stack_ffffffffffffffa4,(QSize *)in_stack_ffffffffffffff98);
      *piVar4 = iVar6;
      QRect::QRect((QRect *)this_00,in_RDI,(QSize *)CONCAT44(iVar6,iVar5));
    }
  }
  else {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayoutInfo::separatorRect(int index) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QRect();
#endif

    const QDockAreaLayoutItem &item = item_list.at(index);
    if (item.skip())
        return QRect();

    QPoint pos = rect.topLeft();
    rpick(o, pos) = item.pos + item.size;
    QSize s = rect.size();
    rpick(o, s) = *sep;

    return QRect(pos, s);
}